

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_str_node_t * ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree,ngx_str_t *val,uint32_t hash)

{
  ngx_rbtree_node_t *pnVar1;
  int iVar2;
  ngx_rbtree_node_t *local_58;
  ngx_rbtree_node_t *local_50;
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t *node;
  ngx_str_node_t *n;
  ngx_int_t rc;
  uint32_t hash_local;
  ngx_str_t *val_local;
  ngx_rbtree_t *rbtree_local;
  
  sentinel = rbtree->root;
  pnVar1 = rbtree->sentinel;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (sentinel == pnVar1) {
            return (ngx_str_node_t *)0x0;
          }
          if ((ulong)hash == sentinel->key) break;
          if ((ulong)hash < sentinel->key) {
            local_50 = sentinel->left;
          }
          else {
            local_50 = sentinel->right;
          }
          sentinel = local_50;
        }
        if (val->len == sentinel[1].key) break;
        if (val->len < sentinel[1].key) {
          local_58 = sentinel->left;
        }
        else {
          local_58 = sentinel->right;
        }
        sentinel = local_58;
      }
      iVar2 = memcmp(val->data,sentinel[1].left,val->len);
      if (-1 < iVar2) break;
      sentinel = sentinel->left;
    }
    if (iVar2 < 1) break;
    sentinel = sentinel->right;
  }
  return (ngx_str_node_t *)sentinel;
}

Assistant:

ngx_str_node_t *
ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree, ngx_str_t *val, uint32_t hash)
{
    ngx_int_t           rc;
    ngx_str_node_t     *n;
    ngx_rbtree_node_t  *node, *sentinel;

    node = rbtree->root;
    sentinel = rbtree->sentinel;

    while (node != sentinel) {

        n = (ngx_str_node_t *) node;

        if (hash != node->key) {
            node = (hash < node->key) ? node->left : node->right;
            continue;
        }

        if (val->len != n->str.len) {
            node = (val->len < n->str.len) ? node->left : node->right;
            continue;
        }

        rc = ngx_memcmp(val->data, n->str.data, val->len);

        if (rc < 0) {
            node = node->left;
            continue;
        }

        if (rc > 0) {
            node = node->right;
            continue;
        }

        return n;
    }

    return NULL;
}